

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nested_status_code.hpp
# Opt level: O2

bool __thiscall
system_error2::detail::
indirecting_domain<system_error2::status_code<_file_io_error_domain>,_std::allocator<system_error2::status_code<_file_io_error_domain>_>_>
::_do_erased_copy(indirecting_domain<system_error2::status_code<_file_io_error_domain>,_std::allocator<system_error2::status_code<_file_io_error_domain>_>_>
                  *this,status_code<void> *dst,status_code<void> *src,payload_info_t dstinfo)

{
  status_code_domain *psVar1;
  unique_id_type uVar2;
  _func_int **pp_Var3;
  status_code_domain *psVar4;
  template_rebind_alloc<payload_type> payload_alloc;
  payload_info_t srcinfo;
  
  (*(this->super_status_code_domain)._vptr_status_code_domain[1])(&srcinfo,this);
  if (src->_domain->_id == (this->super_status_code_domain)._id) {
    if (srcinfo.total_size <= dstinfo.total_size) {
      psVar1 = src[1]._domain;
      psVar4 = (status_code_domain *)
               std::
               allocator_traits<std::allocator<system_error2::detail::indirecting_domain<system_error2::status_code<_file_io_error_domain>,_std::allocator<system_error2::status_code<_file_io_error_domain>_>_>::payload_type>_>
               ::allocate(&payload_alloc,1);
      uVar2 = psVar1->_id;
      pp_Var3 = psVar1[1]._vptr_status_code_domain;
      (((anon_union_24_2_a3349cc7_for_payload_type_0 *)&psVar4->_vptr_status_code_domain)->sc).
      super_mixin<system_error2::detail::status_code_storage<_file_io_error_domain>,__file_io_error_domain>
      .super_status_code_storage<_file_io_error_domain>.super_status_code<void>._domain =
           (status_code_domain *)psVar1->_vptr_status_code_domain;
      psVar4->_id = uVar2;
      psVar4[1]._vptr_status_code_domain = pp_Var3;
      dst->_domain = (status_code_domain *)
                     _indirecting_domain<system_error2::status_code<_file_io_error_domain>,std::allocator<system_error2::status_code<_file_io_error_domain>>>
      ;
      dst[1]._domain = psVar4;
    }
    return srcinfo.total_size <= dstinfo.total_size;
  }
  __assert_fail("src.domain() == *this",
                "/workspace/llm4binary/github/license_c_cmakelists/ned14[P]status-code/include/status-code/nested_status_code.hpp"
                ,0x84,
                "virtual bool system_error2::detail::indirecting_domain<system_error2::status_code<_file_io_error_domain>, std::allocator<system_error2::status_code<_file_io_error_domain>>>::_do_erased_copy(status_code<void> &, const status_code<void> &, payload_info_t) const [StatusCode = system_error2::status_code<_file_io_error_domain>, Allocator = std::allocator<system_error2::status_code<_file_io_error_domain>>]"
               );
}

Assistant:

virtual bool _do_erased_copy(status_code<void> &dst, const status_code<void> &src, payload_info_t dstinfo) const override  // NOLINT
    {
      // Note that dst may not have its domain set
      const auto srcinfo = payload_info();
      assert(src.domain() == *this);
      if(dstinfo.total_size < srcinfo.total_size)
      {
        return false;
      }
      auto &d = static_cast<_mycode &>(dst);               // NOLINT
      const auto &_s = static_cast<const _mycode &>(src);  // NOLINT
      const payload_type &sp = *_s.value();
      typename payload_allocator_traits::template rebind_alloc<payload_type> payload_alloc(sp.alloc);
      auto *dp = payload_allocator_traits::allocate(payload_alloc, 1);
#if defined(_CPPUNWIND) || defined(__EXCEPTIONS) || defined(STANDARDESE_IS_IN_THE_HOUSE)
      try
#endif
      {
        payload_allocator_traits::construct(payload_alloc, dp, sp.sc, sp.alloc);
        new(SYSTEM_ERROR2_ADDRESS_OF(d)) _mycode(in_place, dp);
      }
#if defined(_CPPUNWIND) || defined(__EXCEPTIONS) || defined(STANDARDESE_IS_IN_THE_HOUSE)
      catch(...)
      {
        payload_allocator_traits::deallocate(payload_alloc, dp, 1);
        throw;
      }
#endif
      return true;
    }